

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O3

void __thiscall wasm::PoppifyPass::run(PoppifyPass *this,Module *module)

{
  undefined1 local_138 [8];
  PassRunner subRunner;
  
  PassRunner::PassRunner((PassRunner *)local_138,(this->super_Pass).runner);
  subRunner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x30);
  subRunner.skippedPasses._M_h._M_single_bucket[2]._M_nxt = (_Hash_node_base *)0x0;
  subRunner.skippedPasses._M_h._M_single_bucket[3]._M_nxt = (_Hash_node_base *)0x0;
  (subRunner.skippedPasses._M_h._M_single_bucket)->_M_nxt = (_Hash_node_base *)0x0;
  subRunner.skippedPasses._M_h._M_single_bucket[1]._M_nxt = (_Hash_node_base *)0x0;
  subRunner.skippedPasses._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x0;
  subRunner.skippedPasses._M_h._M_single_bucket[5]._M_nxt = (_Hash_node_base *)0x0;
  subRunner.skippedPasses._M_h._M_single_bucket[2]._M_nxt =
       subRunner.skippedPasses._M_h._M_single_bucket + 4;
  (subRunner.skippedPasses._M_h._M_single_bucket)->_M_nxt = (_Hash_node_base *)&PTR__Pass_00d74e70;
  PassRunner::add((PassRunner *)local_138,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
                  &subRunner.skippedPasses._M_h._M_single_bucket);
  if (subRunner.skippedPasses._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    (*(code *)(subRunner.skippedPasses._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
  }
  subRunner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  PassRunner::run((PassRunner *)local_138);
  lowerTupleGlobals(this,module);
  PassRunner::~PassRunner((PassRunner *)local_138);
  return;
}

Assistant:

void run(Module* module) {
    PassRunner subRunner(getPassRunner());
    subRunner.add(std::make_unique<PoppifyFunctionsPass>());
    // TODO: Enable this once it handles Poppy blocks correctly
    // subRunner.add(std::make_unique<ReFinalize>());
    subRunner.run();
    lowerTupleGlobals(module);
  }